

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O0

void __thiscall
pbrt::StatsAccumulator::ReportMemoryCounter(StatsAccumulator *this,char *name,int64_t val)

{
  mapped_type_conflict *pmVar1;
  long in_RDX;
  allocator<char> *in_stack_ffffffffffffffc0;
  key_type *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                         *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  *pmVar1 = in_RDX + *pmVar1;
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
  return;
}

Assistant:

void StatsAccumulator::ReportMemoryCounter(const char *name, int64_t val) {
    stats->memoryCounters[name] += val;
}